

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginMenu(char *label,bool enabled)

{
  int iVar1;
  ImGuiID IVar2;
  ImGuiWindow *this;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiPopupRef *pIVar5;
  bool bVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  ImGuiID id;
  ImGuiID IVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  ImVec2 IVar16;
  ImVec2 p_min;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  ImVec2 IVar22;
  float fVar23;
  ImVec2 ta;
  ImVec2 tb;
  ImVec2 tc;
  float local_ac;
  ImVec2 local_88;
  float local_7c;
  undefined1 local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  ImVec2 local_50;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  this = GImGui->CurrentWindow;
  this->Accessed = true;
  if (this->SkipItems == false) {
    bVar14 = false;
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar16 = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar19 = IVar16.x;
    fVar17 = IVar16.y;
    iVar1 = (GImGui->CurrentPopupStack).Size;
    if (iVar1 < (GImGui->OpenPopupStack).Size) {
      bVar14 = (GImGui->OpenPopupStack).Data[iVar1].PopupId == id;
    }
    pIVar3 = pIVar7->FocusedWindow;
    if (((this->Flags & 0x2000000) == 0) &&
       (iVar1 = (pIVar7->CurrentPopupStack).Size, iVar1 < (pIVar7->OpenPopupStack).Size)) {
      IVar2 = (pIVar7->OpenPopupStack).Data[iVar1].ParentMenuSet;
      uStack_70 = extraout_XMM0_Dc;
      local_78._0_4_ = IVar16.x;
      local_78._4_4_ = IVar16.y;
      uStack_6c = extraout_XMM0_Dd;
      IVar12 = ImGuiWindow::GetID(this,"##menus",(char *)0x0);
      bVar15 = IVar2 == IVar12;
      fVar19 = (float)local_78._0_4_;
      fVar17 = (float)local_78._4_4_;
      uVar20 = uStack_70;
      uVar21 = uStack_6c;
    }
    else {
      bVar15 = false;
      uVar20 = extraout_XMM0_Dc;
      uVar21 = extraout_XMM0_Dd;
    }
    if (bVar15) {
      pIVar7->FocusedWindow = this;
    }
    local_ac = (this->DC).CursorPos.x;
    fVar23 = (this->DC).CursorPos.y;
    local_68 = ZEXT416((uint)fVar23);
    if ((this->DC).LayoutType == 1) {
      local_78._4_4_ = fVar17;
      local_78._0_4_ = fVar19;
      uStack_70 = uVar20;
      uStack_6c = uVar21;
      fVar19 = 0.0;
      if ((this->Flags & 0x400) != 0) {
        fVar19 = (GImGui->Style).FramePadding.y;
        fVar19 = fVar19 + fVar19 + GImGui->FontBaseSize * this->FontWindowScale;
      }
      local_68 = ZEXT416((uint)(fVar23 - (pIVar7->Style).FramePadding.y));
      local_ac = local_ac - (this->WindowPadding).x;
      (this->DC).CursorPos.x =
           (float)(int)((pIVar7->Style).ItemSpacing.x * 0.5) + (this->DC).CursorPos.x;
      fVar17 = (pIVar7->Style).ItemSpacing.x;
      fVar23 = (pIVar7->Style).ItemSpacing.y;
      local_88.x = fVar17 + fVar17;
      local_88.y = fVar23 + fVar23;
      PushStyleVar(7,&local_88);
      local_88.y = 0.0;
      local_88.x = (float)local_78._0_4_;
      bVar9 = Selectable(label,bVar14,(uint)!enabled << 5 | 9,&local_88);
      PopStyleVar(1);
      pIVar8 = GImGui;
      pIVar4 = GImGui->CurrentWindow;
      pIVar4->Accessed = true;
      if (pIVar4->SkipItems == false) {
        (pIVar4->DC).CursorPos.x = (pIVar8->Style).ItemSpacing.x + (pIVar4->DC).CursorPosPrevLine.x;
        (pIVar4->DC).CursorPos.y = (pIVar4->DC).CursorPosPrevLine.y;
        (pIVar4->DC).CurrentLineHeight = (pIVar4->DC).PrevLineHeight;
        (pIVar4->DC).CurrentLineTextBaseOffset = (pIVar4->DC).PrevLineTextBaseOffset;
      }
      (this->DC).CursorPos.x =
           (float)(int)((pIVar7->Style).ItemSpacing.x * 0.5) + (this->DC).CursorPos.x;
      local_78._0_4_ = (float)local_68._0_4_ + fVar19;
    }
    else {
      local_78._0_4_ = fVar23 - (pIVar7->Style).WindowPadding.y;
      local_7c = ImGuiSimpleColumns::DeclColumns
                           (&this->MenuColumns,fVar19,0.0,(float)(int)(pIVar7->FontSize * 1.2));
      IVar16 = GetContentRegionAvail();
      fVar19 = IVar16.x - local_7c;
      local_48 = ZEXT416(~-(uint)(fVar19 <= 0.0) & (uint)fVar19);
      local_88.y = 0.0;
      local_88.x = local_7c;
      bVar9 = Selectable(label,bVar14,(uint)!enabled << 5 | 0x49,&local_88);
      if (enabled) {
        p_min.x = pIVar7->FontSize * 0.2 + (float)local_48._0_4_ + (this->MenuColumns).Pos[2] +
                  local_ac;
        p_min.y = (float)local_68._0_4_ + 0.0;
        RenderCollapseTriangle(p_min,false,1.0,false);
      }
      else {
        PushStyleColor(0,(pIVar7->Style).Colors + 1);
        IVar16.x = pIVar7->FontSize * 0.2 + (float)local_48._0_4_ + (this->MenuColumns).Pos[2] +
                   local_ac;
        IVar16.y = (float)local_68._0_4_ + 0.0;
        RenderCollapseTriangle(IVar16,false,1.0,false);
        PopStyleColor(1);
      }
    }
    if (enabled) {
      bVar10 = IsHovered(&(this->DC).LastItemRect,id,false);
    }
    else {
      bVar10 = false;
    }
    if (bVar15 != false) {
      pIVar7->FocusedWindow = pIVar3;
    }
    if ((this->Flags & 0xa000000) == 0) {
      if ((bVar15 & bVar14 & bVar9) == 0) {
        if ((bVar9 == false) && ((bVar15 & bVar10) != 1 || bVar14 != false)) {
          bVar11 = 0;
        }
        else {
          bVar11 = 1;
        }
        bVar13 = 0;
      }
      else {
        bVar13 = 1;
        bVar14 = false;
        bVar11 = 0;
      }
    }
    else {
      pIVar3 = pIVar7->HoveredWindow;
      if ((((pIVar3 == this) &&
           (iVar1 = (pIVar7->CurrentPopupStack).Size, iVar1 < (pIVar7->OpenPopupStack).Size)) &&
          (pIVar5 = (pIVar7->OpenPopupStack).Data, pIVar5[iVar1].ParentWindow == this)) &&
         (pIVar4 = pIVar5[iVar1].Window, pIVar4 != (ImGuiWindow *)0x0)) {
        local_38.x = (pIVar4->Pos).x;
        fVar19 = (pIVar4->Pos).y;
        fVar17 = (pIVar4->Size).x + local_38.x;
        IVar22 = pIVar4->Pos;
        fVar23 = (pIVar7->IO).MousePos.x - (pIVar7->IO).MouseDelta.x;
        local_88.y = (pIVar7->IO).MousePos.y - (pIVar7->IO).MouseDelta.y;
        bVar15 = local_38.x != (this->Pos).x;
        bVar6 = (this->Pos).x <= local_38.x;
        if (!bVar6 || !bVar15) {
          IVar22.y = fVar19;
          IVar22.x = fVar17;
          local_38.x = fVar17;
        }
        local_50.x = IVar22.x;
        fVar18 = ABS(fVar23 - local_50.x) * 0.3;
        fVar17 = 30.0;
        if (fVar18 <= 30.0) {
          fVar17 = fVar18;
        }
        fVar17 = (float)(-(uint)(fVar18 < 5.0) & 0x40a00000 | ~-(uint)(fVar18 < 5.0) & (uint)fVar17)
        ;
        local_88.x = fVar23 + *(float *)(&DAT_00195790 + (ulong)(bVar6 && bVar15) * 4);
        local_50.y = IVar22.y;
        fVar23 = (local_50.y - fVar17) - local_88.y;
        if (fVar23 <= -100.0) {
          fVar23 = -100.0;
        }
        local_50.y = fVar23 + local_88.y;
        fVar19 = ((pIVar4->Size).y + fVar19 + fVar17) - local_88.y;
        if (100.0 <= fVar19) {
          fVar19 = 100.0;
        }
        local_38.y = fVar19 + local_88.y;
        bVar15 = ImIsPointInTriangle(&(pIVar7->IO).MousePos,&local_88,&local_50,&local_38);
      }
      else {
        bVar15 = false;
      }
      if ((bVar14 == true && bVar10 == false) && pIVar3 == this) {
        bVar13 = (bVar15 ^ 1U) & pIVar7->HoveredIdPreviousFrame != 0 &
                 pIVar7->HoveredIdPreviousFrame != id;
      }
      else {
        bVar13 = 0;
      }
      bVar11 = (bVar15 | bVar14 | bVar10 ^ 1U) ^ 1;
      if (bVar14 == false) {
        bVar11 = bVar9 & bVar10 | bVar11;
      }
    }
    if ((!enabled) || (bVar13 != 0)) {
      iVar1 = (GImGui->CurrentPopupStack).Size;
      if ((iVar1 < (GImGui->OpenPopupStack).Size) &&
         ((GImGui->OpenPopupStack).Data[iVar1].PopupId == id)) {
        ClosePopupToLevel(iVar1);
      }
    }
    if (((~bVar11 & 1) == 0 && bVar14 == false) &&
       ((pIVar7->CurrentPopupStack).Size < (pIVar7->OpenPopupStack).Size)) {
      bVar14 = false;
      OpenPopupEx(label,false);
    }
    else {
      bVar14 = (bool)(bVar14 | bVar11);
      if (bVar11 != 0) {
        OpenPopupEx(label,false);
      }
      pIVar7 = GImGui;
      if (bVar14 != false) {
        (GImGui->SetNextWindowPosVal).x = local_ac;
        (pIVar7->SetNextWindowPosVal).y = (float)local_78._0_4_;
        pIVar7->SetNextWindowPosCond = 1;
        bVar14 = BeginPopupEx(label,(uint)((this->Flags & 0xa000000U) != 0) << 0x14 | 0x8000080);
        return bVar14;
      }
    }
  }
  else {
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImGuiWindow* backed_focused_window = g.FocusedWindow;

    bool pressed;
    bool menu_is_open = IsPopupOpen(id);
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.CurrentPopupStack.Size && g.OpenPopupStack[g.CurrentPopupStack.Size].ParentMenuSet == window->GetID("##menus"));
    if (menuset_is_open)
        g.FocusedWindow = window;

    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        popup_pos = ImVec2(pos.x - window->WindowPadding.x, pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, style.ItemSpacing * 2.0f);
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_Menu | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        SameLine();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
    }
    else
    {
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float w = window->MenuColumns.DeclColumns(label_size.x, 0.0f, (float)(int)(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_Menu | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_DrawFillAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        if (!enabled) PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
        RenderCollapseTriangle(pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.20f, 0.0f), false);
        if (!enabled) PopStyleColor();
    }

    bool hovered = enabled && IsHovered(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.FocusedWindow = backed_focused_window;

    bool want_open = false, want_close = false;
    if (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_within_opened_triangle = false;
        if (g.HoveredWindow == window && g.OpenPopupStack.Size > g.CurrentPopupStack.Size && g.OpenPopupStack[g.CurrentPopupStack.Size].ParentWindow == window)
        {
            if (ImGuiWindow* next_window = g.OpenPopupStack[g.CurrentPopupStack.Size].Window)
            {
                ImRect next_window_rect = next_window->Rect();
                ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
                ImVec2 tb = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
                ImVec2 tc = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
                float extra = ImClamp(fabsf(ta.x - tb.x) * 0.30f, 5.0f, 30.0f); // add a bit of extra slack.
                ta.x += (window->Pos.x < next_window->Pos.x) ? -0.5f : +0.5f;   // to avoid numerical issues
                tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);            // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
                tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
                moving_within_opened_triangle = ImIsPointInTriangle(g.IO.MousePos, ta, tb, tc);
                //window->DrawList->PushClipRectFullScreen(); window->DrawList->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? 0x80008000 : 0x80000080); window->DrawList->PopClipRect(); // Debug
            }
        }

        want_close = (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_within_opened_triangle);
        want_open = (!menu_is_open && hovered && !moving_within_opened_triangle) || (!menu_is_open && hovered && pressed);
    }
    else if (menu_is_open && pressed && menuset_is_open) // menu-bar: click open menu to close
    {
        want_close = true;
        want_open = menu_is_open = false;
    }
    else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // menu-bar: first click to open, then hover to open others
        want_open = true;
    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(GImGui->CurrentPopupStack.Size);

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.CurrentPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiSetCond_Always);
        ImGuiWindowFlags flags = ImGuiWindowFlags_ShowBorders | ((window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu)) ? ImGuiWindowFlags_ChildMenu|ImGuiWindowFlags_ChildWindow : ImGuiWindowFlags_ChildMenu);
        menu_is_open = BeginPopupEx(label, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }

    return menu_is_open;
}